

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O1

void print<std::queue<int,std::deque<int,std::allocator<int>>>>
               (queue<int,_std::deque<int,_std::allocator<int>_>_> *t,char *s)

{
  long lVar1;
  size_t sVar2;
  ostream *this;
  char local_29;
  
  lVar1 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x10c098);
  }
  else {
    sVar2 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_cur != (t->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_cur) {
    do {
      local_29 = ' ';
      this = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
      std::ostream::operator<<
                (this,*(t->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur);
      std::deque<int,_std::allocator<int>_>::pop_front(&t->c);
    } while ((t->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             (t->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.front();
		t.pop();
	}
	std::cout << std::endl;
}